

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  bool bVar1;
  size_type sVar2;
  ColourGuard *pCVar3;
  iterator this_00;
  reference pvVar4;
  ostream *poVar5;
  ConsoleReporter *in_RDI;
  SourceLineInfo lineInfo;
  iterator itEnd;
  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  it;
  ColourGuard guard;
  ColourGuard *in_stack_ffffffffffffff18;
  ColourGuard *in_stack_ffffffffffffff20;
  lineOfChars value;
  ColourImpl *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff68;
  lineOfChars local_81 [24];
  lineOfChars local_69;
  char *local_68;
  size_t in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  local_40 [5];
  ColourGuard local_18;
  
  printOpenHeader(in_RDI,in_stack_ffffffffffffff68);
  sVar2 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::size
                    (&(in_RDI->super_StreamingReporterBase).m_sectionStack);
  if (1 < sVar2) {
    Detail::unique_ptr<Catch::ColourImpl>::operator->
              (&(in_RDI->super_StreamingReporterBase).super_ReporterBase.m_colour);
    ColourImpl::guardColour
              (in_stack_ffffffffffffff28,(Code)((ulong)in_stack_ffffffffffffff20 >> 0x20));
    pCVar3 = ColourImpl::ColourGuard::engage
                       (in_stack_ffffffffffffff20,(ostream *)in_stack_ffffffffffffff18);
    ColourImpl::ColourGuard::ColourGuard(&local_18,pCVar3);
    ColourImpl::ColourGuard::~ColourGuard(in_stack_ffffffffffffff20);
    std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::begin
              ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)
               in_stack_ffffffffffffff18);
    local_40[0] = __gnu_cxx::
                  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                  ::operator+((__normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                               *)in_stack_ffffffffffffff28,
                              (difference_type)in_stack_ffffffffffffff20);
    this_00 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::end
                        ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)
                         in_stack_ffffffffffffff18);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                          *)in_stack_ffffffffffffff20,
                         (__normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                          *)in_stack_ffffffffffffff18);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
      ::operator->(local_40);
      printHeaderString((ConsoleReporter *)this_00._M_current,in_stack_ffffffffffffffa8,
                        in_stack_ffffffffffffffa0);
      __gnu_cxx::
      __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
      ::operator++(local_40);
    }
    ColourImpl::ColourGuard::~ColourGuard(in_stack_ffffffffffffff20);
  }
  pvVar4 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::back
                     ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)
                      in_stack_ffffffffffffff20);
  local_68 = (pvVar4->lineInfo).file;
  lineOfChars::lineOfChars(&local_69,'-');
  poVar5 = Catch::operator<<((ostream *)in_stack_ffffffffffffff18,
                             (lineOfChars)(char)((ulong)in_stack_ffffffffffffff20 >> 0x38));
  std::operator<<(poVar5,'\n');
  Detail::unique_ptr<Catch::ColourImpl>::operator->
            (&(in_RDI->super_StreamingReporterBase).super_ReporterBase.m_colour);
  ColourImpl::guardColour
            (in_stack_ffffffffffffff28,(Code)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  Catch::operator<<((ostream *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  poVar5 = Catch::operator<<((ostream *)in_stack_ffffffffffffff20,
                             (SourceLineInfo *)in_stack_ffffffffffffff18);
  value.c = (char)((ulong)in_stack_ffffffffffffff20 >> 0x38);
  std::operator<<(poVar5,'\n');
  lineOfChars::lineOfChars(local_81,'.');
  poVar5 = Catch::operator<<((ostream *)in_stack_ffffffffffffff18,value);
  pCVar3 = (ColourGuard *)std::operator<<(poVar5,"\n\n");
  std::ostream::operator<<(pCVar3,std::flush<char,std::char_traits<char>>);
  ColourImpl::ColourGuard::~ColourGuard(pCVar3);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        auto guard = m_colour->guardColour( Colour::Headers ).engage( m_stream );

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;


    m_stream << lineOfChars( '-' ) << '\n'
             << m_colour->guardColour( Colour::FileName ) << lineInfo << '\n'
             << lineOfChars( '.' ) << "\n\n"
             << std::flush;
}